

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * ot::commissioner::coap::Message::SplitUriPath
                  (Error *__return_storage_ptr__,
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *aUriPathList,string *aUriPath)

{
  size_type sVar1;
  string *psVar2;
  bool bVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  size_type pos;
  size_t begin;
  string *uri;
  string *aUriPath_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *aUriPathList_local;
  
  pos = 0;
  begin = (size_t)aUriPath;
  uri = aUriPath;
  aUriPath_local = (string *)aUriPathList;
  aUriPathList_local =
       (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)__return_storage_ptr__;
  while (local_38 = std::__cxx11::string::find_first_of((char)begin,0x2f), psVar2 = aUriPath_local,
        sVar1 = pos, local_38 != 0xffffffffffffffff) {
    if (pos < local_38) {
      std::__cxx11::string::substr((ulong)&local_58,begin);
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)psVar2,&local_58
                );
      std::__cxx11::string::~string((string *)&local_58);
    }
    pos = local_38 + 1;
  }
  uVar4 = std::__cxx11::string::size();
  psVar2 = aUriPath_local;
  if (sVar1 < uVar4) {
    std::__cxx11::string::substr((ulong)&local_88,begin);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)psVar2,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar3 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)aUriPath_local);
  if (bVar3) {
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)aUriPath_local,
               (char (*) [2])0x34d109);
  }
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error Message::SplitUriPath(std::list<std::string> &aUriPathList, const std::string &aUriPath)
{
    const auto &uri = aUriPath;

    size_t begin = 0;
    while (true)
    {
        auto pos = uri.find_first_of('/', begin);
        if (pos == std::string::npos)
        {
            break;
        }
        if (pos > begin)
        {
            aUriPathList.emplace_back(uri.substr(begin, pos - begin));
        }
        begin = pos + 1;
    }

    if (begin < uri.size())
    {
        aUriPathList.emplace_back(uri.substr(begin));
    }

    if (aUriPathList.empty())
    {
        // For example, uri path is "/", "//"
        aUriPathList.emplace_back("/");
    }

    return ERROR_NONE;
}